

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

void __thiscall leveldb::Block::Iter::Prev(Iter *this)

{
  uint uVar1;
  uint index;
  bool bVar2;
  
  uVar1 = this->current_;
  index = this->restart_index_;
  while (uVar1 <= *(uint *)(this->data_ + (ulong)index * 4 + (ulong)this->restarts_)) {
    bVar2 = index == 0;
    index = index - 1;
    if (bVar2) {
      this->current_ = this->restarts_;
      this->restart_index_ = this->num_restarts_;
      return;
    }
    this->restart_index_ = index;
  }
  SeekToRestartPoint(this,index);
  do {
    bVar2 = ParseNextKey(this);
    if (!bVar2) {
      return;
    }
  } while ((this->value_).data_ + ((this->value_).size_ - (long)this->data_) < (char *)(ulong)uVar1)
  ;
  return;
}

Assistant:

void Prev() override {
    assert(Valid());

    // Scan backwards to a restart point before current_
    const uint32_t original = current_;
    while (GetRestartPoint(restart_index_) >= original) {
      if (restart_index_ == 0) {
        // No more entries
        current_ = restarts_;
        restart_index_ = num_restarts_;
        return;
      }
      restart_index_--;
    }

    SeekToRestartPoint(restart_index_);
    do {
      // Loop until end of current entry hits the start of original entry
    } while (ParseNextKey() && NextEntryOffset() < original);
  }